

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sigmoid_x86_avx2.cpp
# Opt level: O2

int __thiscall
ncnn::Sigmoid_x86_avx2::forward_inplace(Sigmoid_x86_avx2 *this,Mat *bottom_top_blob,Option *opt)

{
  undefined1 auVar1 [32];
  float fVar2;
  float fVar3;
  float fVar4;
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  void *pvVar7;
  int iVar8;
  undefined1 (*pauVar9) [32];
  int _c;
  int iVar10;
  long lVar11;
  int iVar12;
  bool bVar13;
  float fVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [32];
  undefined1 auVar43 [16];
  undefined1 auVar44 [32];
  undefined1 auVar45 [16];
  undefined1 auVar46 [32];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [32];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [16];
  undefined1 auVar61 [32];
  undefined1 auVar62 [16];
  undefined1 auVar63 [32];
  undefined1 auVar64 [16];
  undefined1 auVar65 [32];
  undefined1 auVar66 [16];
  undefined1 auVar67 [32];
  undefined1 auVar68 [16];
  undefined1 auVar69 [32];
  undefined1 auVar70 [16];
  undefined1 auVar71 [32];
  undefined1 auVar72 [16];
  undefined1 auVar73 [32];
  undefined1 auVar74 [16];
  undefined1 auVar75 [32];
  undefined1 auVar76 [16];
  undefined1 auVar77 [32];
  Mat local_a0;
  undefined4 local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined4 uStack_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  
  iVar10 = bottom_top_blob->c;
  iVar12 = bottom_top_blob->h * bottom_top_blob->w;
  _c = 0;
  iVar8 = 0;
  if (bottom_top_blob->elempack == 8) {
    if (iVar12 < 1) {
      iVar12 = _c;
    }
    if (iVar10 < 1) {
      iVar10 = iVar8;
    }
    auVar35._8_4_ = 0x3f800000;
    auVar35._0_8_ = 0x3f8000003f800000;
    auVar35._12_4_ = 0x3f800000;
    auVar35._16_4_ = 0x3f800000;
    auVar35._20_4_ = 0x3f800000;
    auVar35._24_4_ = 0x3f800000;
    auVar35._28_4_ = 0x3f800000;
    for (; _c != iVar10; _c = _c + 1) {
      ncnn::Mat::channel(&local_a0,bottom_top_blob,_c);
      pauVar9 = (undefined1 (*) [32])local_a0.data;
      ncnn::Mat::~Mat(&local_a0);
      auVar77._8_4_ = 0x3e2aaaaa;
      auVar77._0_8_ = 0x3e2aaaaa3e2aaaaa;
      auVar77._12_4_ = 0x3e2aaaaa;
      auVar77._16_4_ = 0x3e2aaaaa;
      auVar77._20_4_ = 0x3e2aaaaa;
      auVar77._24_4_ = 0x3e2aaaaa;
      auVar77._28_4_ = 0x3e2aaaaa;
      auVar75._8_4_ = 0x3d2aa9c1;
      auVar75._0_8_ = 0x3d2aa9c13d2aa9c1;
      auVar75._12_4_ = 0x3d2aa9c1;
      auVar75._16_4_ = 0x3d2aa9c1;
      auVar75._20_4_ = 0x3d2aa9c1;
      auVar75._24_4_ = 0x3d2aa9c1;
      auVar75._28_4_ = 0x3d2aa9c1;
      auVar73._8_4_ = 0x3c088908;
      auVar73._0_8_ = 0x3c0889083c088908;
      auVar73._12_4_ = 0x3c088908;
      auVar73._16_4_ = 0x3c088908;
      auVar73._20_4_ = 0x3c088908;
      auVar73._24_4_ = 0x3c088908;
      auVar73._28_4_ = 0x3c088908;
      auVar71._8_4_ = 0x3ab743ce;
      auVar71._0_8_ = 0x3ab743ce3ab743ce;
      auVar71._12_4_ = 0x3ab743ce;
      auVar71._16_4_ = 0x3ab743ce;
      auVar71._20_4_ = 0x3ab743ce;
      auVar71._24_4_ = 0x3ab743ce;
      auVar71._28_4_ = 0x3ab743ce;
      auVar69._8_4_ = 0x39506967;
      auVar69._0_8_ = 0x3950696739506967;
      auVar69._12_4_ = 0x39506967;
      auVar69._16_4_ = 0x39506967;
      auVar69._20_4_ = 0x39506967;
      auVar69._24_4_ = 0x39506967;
      auVar69._28_4_ = 0x39506967;
      auVar67._8_4_ = 0xbf317218;
      auVar67._0_8_ = 0xbf317218bf317218;
      auVar67._12_4_ = 0xbf317218;
      auVar67._16_4_ = 0xbf317218;
      auVar67._20_4_ = 0xbf317218;
      auVar67._24_4_ = 0xbf317218;
      auVar67._28_4_ = 0xbf317218;
      auVar65._8_4_ = 0x3f800000;
      auVar65._0_8_ = 0x3f8000003f800000;
      auVar65._12_4_ = 0x3f800000;
      auVar65._16_4_ = 0x3f800000;
      auVar65._20_4_ = 0x3f800000;
      auVar65._24_4_ = 0x3f800000;
      auVar65._28_4_ = 0x3f800000;
      auVar63._8_4_ = 0x3f000000;
      auVar63._0_8_ = 0x3f0000003f000000;
      auVar63._12_4_ = 0x3f000000;
      auVar63._16_4_ = 0x3f000000;
      auVar63._20_4_ = 0x3f000000;
      auVar63._24_4_ = 0x3f000000;
      auVar63._28_4_ = 0x3f000000;
      auVar61._8_4_ = 0x3fb8aa3b;
      auVar61._0_8_ = 0x3fb8aa3b3fb8aa3b;
      auVar61._12_4_ = 0x3fb8aa3b;
      auVar61._16_4_ = 0x3fb8aa3b;
      auVar61._20_4_ = 0x3fb8aa3b;
      auVar61._24_4_ = 0x3fb8aa3b;
      auVar61._28_4_ = 0x3fb8aa3b;
      auVar55._8_4_ = 0xc2b0c0a5;
      auVar55._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar55._12_4_ = 0xc2b0c0a5;
      auVar55._16_4_ = 0xc2b0c0a5;
      auVar55._20_4_ = 0xc2b0c0a5;
      auVar55._24_4_ = 0xc2b0c0a5;
      auVar55._28_4_ = 0xc2b0c0a5;
      auVar22._8_4_ = 0x42b0c0a5;
      auVar22._0_8_ = 0x42b0c0a542b0c0a5;
      auVar22._12_4_ = 0x42b0c0a5;
      auVar22._16_4_ = 0x42b0c0a5;
      auVar22._20_4_ = 0x42b0c0a5;
      auVar22._24_4_ = 0x42b0c0a5;
      auVar22._28_4_ = 0x42b0c0a5;
      iVar8 = iVar12;
      while (bVar13 = iVar8 != 0, iVar8 = iVar8 + -1, bVar13) {
        auVar30._0_8_ = *(ulong *)*pauVar9 ^ 0x8000000080000000;
        auVar30._8_4_ = *(uint *)(*pauVar9 + 8) ^ 0x80000000;
        auVar30._12_4_ = *(uint *)(*pauVar9 + 0xc) ^ 0x80000000;
        auVar30._16_4_ = *(uint *)(*pauVar9 + 0x10) ^ 0x80000000;
        auVar30._20_4_ = *(uint *)(*pauVar9 + 0x14) ^ 0x80000000;
        auVar30._24_4_ = *(uint *)(*pauVar9 + 0x18) ^ 0x80000000;
        auVar30._28_4_ = *(uint *)(*pauVar9 + 0x1c) ^ 0x80000000;
        auVar30 = vminps_avx(auVar30,auVar22);
        auVar1 = vmaxps_avx(auVar30,auVar55);
        auVar25 = vfmadd213ps_fma(auVar61,auVar1,auVar63);
        auVar20 = vroundps_avx(ZEXT1632(auVar25),1);
        auVar30 = vcmpps_avx(ZEXT1632(auVar25),auVar20,1);
        auVar30 = vandps_avx(auVar65,auVar30);
        auVar30 = vsubps_avx(auVar20,auVar30);
        auVar26 = vfmadd231ps_fma(auVar1,auVar30,auVar67);
        auVar19 = ZEXT1632(auVar26);
        fVar14 = auVar26._0_4_;
        fVar2 = auVar26._4_4_;
        fVar3 = auVar26._8_4_;
        fVar4 = auVar26._12_4_;
        auVar1._28_4_ = auVar20._28_4_;
        auVar1._0_28_ =
             ZEXT1628(CONCAT412(fVar4 * fVar4,
                                CONCAT48(fVar3 * fVar3,CONCAT44(fVar2 * fVar2,fVar14 * fVar14))));
        auVar25 = vfmadd213ps_fma(auVar69,auVar19,auVar71);
        auVar25 = vfmadd213ps_fma(ZEXT1632(auVar25),auVar19,auVar73);
        auVar25 = vfmadd213ps_fma(ZEXT1632(auVar25),auVar19,auVar75);
        auVar25 = vfmadd213ps_fma(ZEXT1632(auVar25),ZEXT1632(auVar26),auVar77);
        auVar25 = vfmadd213ps_fma(ZEXT1632(auVar25),ZEXT1632(auVar26),auVar63);
        auVar20._0_4_ = fVar14 + 1.0;
        auVar20._4_4_ = fVar2 + 1.0;
        auVar20._8_4_ = fVar3 + 1.0;
        auVar20._12_4_ = fVar4 + 1.0;
        auVar20._16_4_ = 0x3f800000;
        auVar20._20_4_ = 0x3f800000;
        auVar20._24_4_ = 0x3f800000;
        auVar20._28_4_ = 0x3f800000;
        auVar25 = vfmadd231ps_fma(auVar20,auVar1,ZEXT1632(auVar25));
        auVar19._0_4_ = (int)auVar30._0_4_;
        auVar19._4_4_ = (int)auVar30._4_4_;
        auVar19._8_4_ = (int)auVar30._8_4_;
        auVar19._12_4_ = (int)auVar30._12_4_;
        auVar19._16_4_ = (int)auVar30._16_4_;
        auVar19._20_4_ = (int)auVar30._20_4_;
        auVar19._24_4_ = (int)auVar30._24_4_;
        auVar19._28_4_ = (int)auVar30._28_4_;
        auVar30 = vpslld_avx2(auVar19,0x17);
        auVar30 = vpaddd_avx2(auVar30,auVar35);
        auVar25 = vfmadd213ps_fma(auVar30,ZEXT1632(auVar25),auVar65);
        auVar30 = vrcpps_avx(ZEXT1632(auVar25));
        auVar25 = vfmsub213ps_fma(ZEXT1632(auVar25),auVar30,auVar65);
        auVar25 = vfnmadd132ps_fma(ZEXT1632(auVar25),auVar30,auVar30);
        *pauVar9 = ZEXT1632(auVar25);
        pauVar9 = pauVar9 + 1;
      }
    }
  }
  else if (bottom_top_blob->elempack == 4) {
    if (iVar12 < 1) {
      iVar12 = _c;
    }
    if (iVar10 < 1) {
      iVar10 = iVar8;
    }
    auVar15._8_4_ = 0x3f800000;
    auVar15._0_8_ = 0x3f8000003f800000;
    auVar15._12_4_ = 0x3f800000;
    for (; _c != iVar10; _c = _c + 1) {
      ncnn::Mat::channel(&local_a0,bottom_top_blob,_c);
      pauVar9 = (undefined1 (*) [32])local_a0.data;
      ncnn::Mat::~Mat(&local_a0);
      auVar76._8_4_ = 0x3e2aaaaa;
      auVar76._0_8_ = 0x3e2aaaaa3e2aaaaa;
      auVar76._12_4_ = 0x3e2aaaaa;
      auVar74._8_4_ = 0x3d2aa9c1;
      auVar74._0_8_ = 0x3d2aa9c13d2aa9c1;
      auVar74._12_4_ = 0x3d2aa9c1;
      auVar72._8_4_ = 0x3c088908;
      auVar72._0_8_ = 0x3c0889083c088908;
      auVar72._12_4_ = 0x3c088908;
      auVar70._8_4_ = 0x3ab743ce;
      auVar70._0_8_ = 0x3ab743ce3ab743ce;
      auVar70._12_4_ = 0x3ab743ce;
      auVar68._8_4_ = 0x39506967;
      auVar68._0_8_ = 0x3950696739506967;
      auVar68._12_4_ = 0x39506967;
      auVar66._8_4_ = 0xbf317218;
      auVar66._0_8_ = 0xbf317218bf317218;
      auVar66._12_4_ = 0xbf317218;
      auVar64._8_4_ = 0x3f800000;
      auVar64._0_8_ = 0x3f8000003f800000;
      auVar64._12_4_ = 0x3f800000;
      auVar62._8_4_ = 0x3f000000;
      auVar62._0_8_ = 0x3f0000003f000000;
      auVar62._12_4_ = 0x3f000000;
      auVar60._8_4_ = 0x3fb8aa3b;
      auVar60._0_8_ = 0x3fb8aa3b3fb8aa3b;
      auVar60._12_4_ = 0x3fb8aa3b;
      auVar50._8_4_ = 0xc2b0c0a5;
      auVar50._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar50._12_4_ = 0xc2b0c0a5;
      auVar47._8_4_ = 0x42b0c0a5;
      auVar47._0_8_ = 0x42b0c0a542b0c0a5;
      auVar47._12_4_ = 0x42b0c0a5;
      iVar8 = iVar12;
      while (bVar13 = iVar8 != 0, iVar8 = iVar8 + -1, bVar13) {
        auVar16._0_8_ = *(ulong *)*pauVar9 ^ 0x8000000080000000;
        auVar16._8_4_ = *(uint *)(*pauVar9 + 8) ^ 0x80000000;
        auVar16._12_4_ = *(uint *)(*pauVar9 + 0xc) ^ 0x80000000;
        auVar25 = vminps_avx(auVar16,auVar47);
        auVar18 = vmaxps_avx(auVar25,auVar50);
        auVar25 = vfmadd213ps_fma(auVar60,auVar18,auVar62);
        auVar36._0_4_ = (int)auVar25._0_4_;
        auVar36._4_4_ = (int)auVar25._4_4_;
        auVar36._8_4_ = (int)auVar25._8_4_;
        auVar36._12_4_ = (int)auVar25._12_4_;
        auVar26 = vcvtdq2ps_avx(auVar36);
        auVar25 = vcmpps_avx(auVar25,auVar26,1);
        auVar25 = vandps_avx(auVar64,auVar25);
        auVar25 = vsubps_avx(auVar26,auVar25);
        auVar18 = vfmadd231ps_fma(auVar18,auVar25,auVar66);
        fVar14 = auVar18._0_4_;
        auVar37._0_4_ = fVar14 * fVar14;
        fVar2 = auVar18._4_4_;
        auVar37._4_4_ = fVar2 * fVar2;
        fVar3 = auVar18._8_4_;
        auVar37._8_4_ = fVar3 * fVar3;
        fVar4 = auVar18._12_4_;
        auVar37._12_4_ = fVar4 * fVar4;
        auVar26 = vfmadd213ps_fma(auVar68,auVar18,auVar70);
        auVar26 = vfmadd213ps_fma(auVar26,auVar18,auVar72);
        auVar26 = vfmadd213ps_fma(auVar26,auVar18,auVar74);
        auVar26 = vfmadd213ps_fma(auVar26,auVar18,auVar76);
        auVar26 = vfmadd213ps_fma(auVar26,auVar18,auVar62);
        auVar17._0_4_ = fVar14 + 1.0;
        auVar17._4_4_ = fVar2 + 1.0;
        auVar17._8_4_ = fVar3 + 1.0;
        auVar17._12_4_ = fVar4 + 1.0;
        auVar26 = vfmadd231ps_fma(auVar17,auVar37,auVar26);
        auVar24._0_4_ = (int)auVar25._0_4_;
        auVar24._4_4_ = (int)auVar25._4_4_;
        auVar24._8_4_ = (int)auVar25._8_4_;
        auVar24._12_4_ = (int)auVar25._12_4_;
        auVar25 = vpslld_avx(auVar24,0x17);
        auVar25 = vpaddd_avx(auVar25,auVar15);
        auVar26 = vfmadd213ps_fma(auVar25,auVar26,auVar64);
        auVar25 = vrcpps_avx(auVar26);
        auVar26 = vfmsub213ps_fma(auVar26,auVar25,auVar64);
        auVar25 = vfnmadd132ps_fma(auVar26,auVar25,auVar25);
        *(undefined1 (*) [16])*pauVar9 = auVar25;
        pauVar9 = (undefined1 (*) [32])(*pauVar9 + 0x10);
      }
    }
  }
  else {
    if (iVar10 < 1) {
      iVar10 = iVar8;
    }
    local_58 = 0x3f800000;
    uStack_54 = 0x3f800000;
    uStack_50 = 0x3f800000;
    uStack_4c = 0x3f800000;
    uStack_48 = 0x3f800000;
    uStack_44 = 0x3f800000;
    uStack_40 = 0x3f800000;
    uStack_3c = 0x3f800000;
    for (; _c != iVar10; _c = _c + 1) {
      ncnn::Mat::channel(&local_a0,bottom_top_blob,_c);
      pvVar7 = local_a0.data;
      ncnn::Mat::~Mat(&local_a0);
      lVar11 = 0;
      pauVar9 = (undefined1 (*) [32])pvVar7;
      for (iVar8 = 0; iVar8 + 7 < iVar12; iVar8 = iVar8 + 8) {
        auVar21._0_8_ = *(ulong *)*pauVar9 ^ 0x8000000080000000;
        auVar21._8_4_ = *(uint *)(*pauVar9 + 8) ^ 0x80000000;
        auVar21._12_4_ = *(uint *)(*pauVar9 + 0xc) ^ 0x80000000;
        auVar21._16_4_ = *(uint *)(*pauVar9 + 0x10) ^ 0x80000000;
        auVar21._20_4_ = *(uint *)(*pauVar9 + 0x14) ^ 0x80000000;
        auVar21._24_4_ = *(uint *)(*pauVar9 + 0x18) ^ 0x80000000;
        auVar21._28_4_ = *(uint *)(*pauVar9 + 0x1c) ^ 0x80000000;
        auVar31._8_4_ = 0x42b0c0a5;
        auVar31._0_8_ = 0x42b0c0a542b0c0a5;
        auVar31._12_4_ = 0x42b0c0a5;
        auVar31._16_4_ = 0x42b0c0a5;
        auVar31._20_4_ = 0x42b0c0a5;
        auVar31._24_4_ = 0x42b0c0a5;
        auVar31._28_4_ = 0x42b0c0a5;
        auVar35 = vminps_avx(auVar21,auVar31);
        auVar32._8_4_ = 0xc2b0c0a5;
        auVar32._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar32._12_4_ = 0xc2b0c0a5;
        auVar32._16_4_ = 0xc2b0c0a5;
        auVar32._20_4_ = 0xc2b0c0a5;
        auVar32._24_4_ = 0xc2b0c0a5;
        auVar32._28_4_ = 0xc2b0c0a5;
        auVar22 = vmaxps_avx(auVar35,auVar32);
        auVar33._8_4_ = 0x3fb8aa3b;
        auVar33._0_8_ = 0x3fb8aa3b3fb8aa3b;
        auVar33._12_4_ = 0x3fb8aa3b;
        auVar33._16_4_ = 0x3fb8aa3b;
        auVar33._20_4_ = 0x3fb8aa3b;
        auVar33._24_4_ = 0x3fb8aa3b;
        auVar33._28_4_ = 0x3fb8aa3b;
        auVar46._8_4_ = 0x3f000000;
        auVar46._0_8_ = 0x3f0000003f000000;
        auVar46._12_4_ = 0x3f000000;
        auVar46._16_4_ = 0x3f000000;
        auVar46._20_4_ = 0x3f000000;
        auVar46._24_4_ = 0x3f000000;
        auVar46._28_4_ = 0x3f000000;
        auVar25 = vfmadd213ps_fma(auVar33,auVar22,auVar46);
        auVar55 = vroundps_avx(ZEXT1632(auVar25),1);
        auVar35 = vcmpps_avx(ZEXT1632(auVar25),auVar55,1);
        auVar49._8_4_ = 0x3f800000;
        auVar49._0_8_ = 0x3f8000003f800000;
        auVar49._12_4_ = 0x3f800000;
        auVar49._16_4_ = 0x3f800000;
        auVar49._20_4_ = 0x3f800000;
        auVar49._24_4_ = 0x3f800000;
        auVar49._28_4_ = 0x3f800000;
        auVar35 = vandps_avx(auVar35,auVar49);
        auVar35 = vsubps_avx(auVar55,auVar35);
        auVar42._8_4_ = 0xbf317218;
        auVar42._0_8_ = 0xbf317218bf317218;
        auVar42._12_4_ = 0xbf317218;
        auVar42._16_4_ = 0xbf317218;
        auVar42._20_4_ = 0xbf317218;
        auVar42._24_4_ = 0xbf317218;
        auVar42._28_4_ = 0xbf317218;
        auVar26 = vfmadd231ps_fma(auVar22,auVar35,auVar42);
        auVar22 = ZEXT1632(auVar26);
        fVar14 = auVar26._0_4_;
        fVar2 = auVar26._4_4_;
        fVar3 = auVar26._8_4_;
        fVar4 = auVar26._12_4_;
        auVar5._28_4_ = 0xbf317218;
        auVar5._0_28_ =
             ZEXT1628(CONCAT412(fVar4 * fVar4,
                                CONCAT48(fVar3 * fVar3,CONCAT44(fVar2 * fVar2,fVar14 * fVar14))));
        auVar44._8_4_ = 0x39506967;
        auVar44._0_8_ = 0x3950696739506967;
        auVar44._12_4_ = 0x39506967;
        auVar44._16_4_ = 0x39506967;
        auVar44._20_4_ = 0x39506967;
        auVar44._24_4_ = 0x39506967;
        auVar44._28_4_ = 0x39506967;
        auVar56._8_4_ = 0x3ab743ce;
        auVar56._0_8_ = 0x3ab743ce3ab743ce;
        auVar56._12_4_ = 0x3ab743ce;
        auVar56._16_4_ = 0x3ab743ce;
        auVar56._20_4_ = 0x3ab743ce;
        auVar56._24_4_ = 0x3ab743ce;
        auVar56._28_4_ = 0x3ab743ce;
        auVar25 = vfmadd213ps_fma(auVar44,auVar22,auVar56);
        auVar57._8_4_ = 0x3c088908;
        auVar57._0_8_ = 0x3c0889083c088908;
        auVar57._12_4_ = 0x3c088908;
        auVar57._16_4_ = 0x3c088908;
        auVar57._20_4_ = 0x3c088908;
        auVar57._24_4_ = 0x3c088908;
        auVar57._28_4_ = 0x3c088908;
        auVar25 = vfmadd213ps_fma(ZEXT1632(auVar25),auVar22,auVar57);
        auVar58._8_4_ = 0x3d2aa9c1;
        auVar58._0_8_ = 0x3d2aa9c13d2aa9c1;
        auVar58._12_4_ = 0x3d2aa9c1;
        auVar58._16_4_ = 0x3d2aa9c1;
        auVar58._20_4_ = 0x3d2aa9c1;
        auVar58._24_4_ = 0x3d2aa9c1;
        auVar58._28_4_ = 0x3d2aa9c1;
        auVar25 = vfmadd213ps_fma(ZEXT1632(auVar25),auVar22,auVar58);
        auVar59._8_4_ = 0x3e2aaaaa;
        auVar59._0_8_ = 0x3e2aaaaa3e2aaaaa;
        auVar59._12_4_ = 0x3e2aaaaa;
        auVar59._16_4_ = 0x3e2aaaaa;
        auVar59._20_4_ = 0x3e2aaaaa;
        auVar59._24_4_ = 0x3e2aaaaa;
        auVar59._28_4_ = 0x3e2aaaaa;
        auVar25 = vfmadd213ps_fma(ZEXT1632(auVar25),ZEXT1632(auVar26),auVar59);
        auVar25 = vfmadd213ps_fma(ZEXT1632(auVar25),ZEXT1632(auVar26),auVar46);
        auVar23._0_4_ = fVar14 + 1.0;
        auVar23._4_4_ = fVar2 + 1.0;
        auVar23._8_4_ = fVar3 + 1.0;
        auVar23._12_4_ = fVar4 + 1.0;
        auVar23._16_4_ = 0x3f800000;
        auVar23._20_4_ = 0x3f800000;
        auVar23._24_4_ = 0x3f800000;
        auVar23._28_4_ = 0x3f800000;
        auVar25 = vfmadd231ps_fma(auVar23,auVar5,ZEXT1632(auVar25));
        auVar34._0_4_ = (int)auVar35._0_4_;
        auVar34._4_4_ = (int)auVar35._4_4_;
        auVar34._8_4_ = (int)auVar35._8_4_;
        auVar34._12_4_ = (int)auVar35._12_4_;
        auVar34._16_4_ = (int)auVar35._16_4_;
        auVar34._20_4_ = (int)auVar35._20_4_;
        auVar34._24_4_ = (int)auVar35._24_4_;
        auVar34._28_4_ = (int)auVar35._28_4_;
        auVar35 = vpslld_avx2(auVar34,0x17);
        auVar6._4_4_ = uStack_54;
        auVar6._0_4_ = local_58;
        auVar6._8_4_ = uStack_50;
        auVar6._12_4_ = uStack_4c;
        auVar6._16_4_ = uStack_48;
        auVar6._20_4_ = uStack_44;
        auVar6._24_4_ = uStack_40;
        auVar6._28_4_ = uStack_3c;
        auVar35 = vpaddd_avx2(auVar35,auVar6);
        auVar25 = vfmadd213ps_fma(auVar35,ZEXT1632(auVar25),auVar49);
        auVar35 = vrcpps_avx(ZEXT1632(auVar25));
        auVar25 = vfmsub213ps_fma(ZEXT1632(auVar25),auVar35,auVar49);
        auVar25 = vfnmadd132ps_fma(ZEXT1632(auVar25),auVar35,auVar35);
        *pauVar9 = ZEXT1632(auVar25);
        pauVar9 = pauVar9 + 1;
        lVar11 = lVar11 + 8;
      }
      for (; iVar8 + 3 < iVar12; iVar8 = iVar8 + 4) {
        auVar25._0_8_ = *(ulong *)*pauVar9 ^ 0x8000000080000000;
        auVar25._8_4_ = *(uint *)(*pauVar9 + 8) ^ 0x80000000;
        auVar25._12_4_ = *(uint *)(*pauVar9 + 0xc) ^ 0x80000000;
        auVar26._8_4_ = 0x42b0c0a5;
        auVar26._0_8_ = 0x42b0c0a542b0c0a5;
        auVar26._12_4_ = 0x42b0c0a5;
        auVar25 = vminps_avx(auVar25,auVar26);
        auVar27._8_4_ = 0xc2b0c0a5;
        auVar27._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar27._12_4_ = 0xc2b0c0a5;
        auVar18 = vmaxps_avx(auVar25,auVar27);
        auVar28._8_4_ = 0x3fb8aa3b;
        auVar28._0_8_ = 0x3fb8aa3b3fb8aa3b;
        auVar28._12_4_ = 0x3fb8aa3b;
        auVar45._8_4_ = 0x3f000000;
        auVar45._0_8_ = 0x3f0000003f000000;
        auVar45._12_4_ = 0x3f000000;
        auVar25 = vfmadd213ps_fma(auVar28,auVar18,auVar45);
        auVar38._0_4_ = (int)auVar25._0_4_;
        auVar38._4_4_ = (int)auVar25._4_4_;
        auVar38._8_4_ = (int)auVar25._8_4_;
        auVar38._12_4_ = (int)auVar25._12_4_;
        auVar26 = vcvtdq2ps_avx(auVar38);
        auVar25 = vcmpps_avx(auVar25,auVar26,1);
        auVar48._8_4_ = 0x3f800000;
        auVar48._0_8_ = 0x3f8000003f800000;
        auVar48._12_4_ = 0x3f800000;
        auVar25 = vandps_avx(auVar25,auVar48);
        auVar25 = vsubps_avx(auVar26,auVar25);
        auVar39._8_4_ = 0xbf317218;
        auVar39._0_8_ = 0xbf317218bf317218;
        auVar39._12_4_ = 0xbf317218;
        auVar18 = vfmadd231ps_fma(auVar18,auVar25,auVar39);
        fVar14 = auVar18._0_4_;
        auVar40._0_4_ = fVar14 * fVar14;
        fVar2 = auVar18._4_4_;
        auVar40._4_4_ = fVar2 * fVar2;
        fVar3 = auVar18._8_4_;
        auVar40._8_4_ = fVar3 * fVar3;
        fVar4 = auVar18._12_4_;
        auVar40._12_4_ = fVar4 * fVar4;
        auVar43._8_4_ = 0x39506967;
        auVar43._0_8_ = 0x3950696739506967;
        auVar43._12_4_ = 0x39506967;
        auVar51._8_4_ = 0x3ab743ce;
        auVar51._0_8_ = 0x3ab743ce3ab743ce;
        auVar51._12_4_ = 0x3ab743ce;
        auVar26 = vfmadd213ps_fma(auVar43,auVar18,auVar51);
        auVar52._8_4_ = 0x3c088908;
        auVar52._0_8_ = 0x3c0889083c088908;
        auVar52._12_4_ = 0x3c088908;
        auVar26 = vfmadd213ps_fma(auVar26,auVar18,auVar52);
        auVar53._8_4_ = 0x3d2aa9c1;
        auVar53._0_8_ = 0x3d2aa9c13d2aa9c1;
        auVar53._12_4_ = 0x3d2aa9c1;
        auVar26 = vfmadd213ps_fma(auVar26,auVar18,auVar53);
        auVar54._8_4_ = 0x3e2aaaaa;
        auVar54._0_8_ = 0x3e2aaaaa3e2aaaaa;
        auVar54._12_4_ = 0x3e2aaaaa;
        auVar26 = vfmadd213ps_fma(auVar26,auVar18,auVar54);
        auVar26 = vfmadd213ps_fma(auVar26,auVar18,auVar45);
        auVar18._0_4_ = fVar14 + 1.0;
        auVar18._4_4_ = fVar2 + 1.0;
        auVar18._8_4_ = fVar3 + 1.0;
        auVar18._12_4_ = fVar4 + 1.0;
        auVar26 = vfmadd231ps_fma(auVar18,auVar40,auVar26);
        auVar29._0_4_ = (int)auVar25._0_4_;
        auVar29._4_4_ = (int)auVar25._4_4_;
        auVar29._8_4_ = (int)auVar25._8_4_;
        auVar29._12_4_ = (int)auVar25._12_4_;
        auVar25 = vpslld_avx(auVar29,0x17);
        auVar41._8_4_ = 0x3f800000;
        auVar41._0_8_ = 0x3f8000003f800000;
        auVar41._12_4_ = 0x3f800000;
        auVar25 = vpaddd_avx(auVar25,auVar41);
        auVar26 = vfmadd213ps_fma(auVar25,auVar26,auVar48);
        auVar25 = vrcpps_avx(auVar26);
        auVar26 = vfmsub213ps_fma(auVar26,auVar25,auVar48);
        auVar25 = vfnmadd132ps_fma(auVar26,auVar25,auVar25);
        *(undefined1 (*) [16])*pauVar9 = auVar25;
        pauVar9 = (undefined1 (*) [32])(*pauVar9 + 0x10);
        lVar11 = lVar11 + 4;
      }
      for (; (int)lVar11 < iVar12; lVar11 = lVar11 + 1) {
        fVar14 = expf(-*(float *)((undefined1 *)pvVar7 + lVar11 * 4));
        *(float *)((undefined1 *)pvVar7 + lVar11 * 4) = 1.0 / (fVar14 + 1.0);
      }
    }
  }
  return 0;
}

Assistant:

int Sigmoid_x86_avx2::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;
    int size = w * h;
#if __SSE2__
    int elempack = bottom_top_blob.elempack;

#if __AVX__
    if (elempack == 8)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);
            for (int i = 0; i < size; i++)
            {
                __m256 _p = _mm256_loadu_ps(ptr);
                _mm256_storeu_ps(ptr, sigmoid_avx(_p));
                ptr += 8;
            }
        }

        return 0;
    }
#endif // __AVX__

    if (elempack == 4)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);
            for (int i = 0; i < size; i++)
            {
                __m128 _p = _mm_loadu_ps(ptr);
                _mm_storeu_ps(ptr, sigmoid_sse(_p));
                ptr += 4;
            }
        }

        return 0;
    }
#endif // __SSE2__

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            _mm256_storeu_ps(ptr, sigmoid_avx(_p));
            ptr += 8;
        }
#endif // __AVX__
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_loadu_ps(ptr);
            _mm_storeu_ps(ptr, sigmoid_sse(_p));
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *ptr = 1.f / (1.f + exp(-*ptr));

            ptr++;
        }
    }

    return 0;
}